

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O2

value_t __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>
::compute_diameter(Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>
                   *this,simplex_t index,dimension_t dim)

{
  int iVar1;
  pointer piVar2;
  int iVar3;
  int iVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>
  local_30 [8];
  pointer local_28;
  
  iVar4 = (int)CONCAT71(in_register_00000011,dim);
  std::vector<int,_std::allocator<int>_>::resize(&this->vertices,(long)iVar4 + 1);
  local_28 = (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>
  ::
  get_simplex_vertices<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
            (local_30,(simplex_t)this,(dimension_t)index,iVar4,
             (reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
              *)((ulong)((long)(this->dist).rows.
                               super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->dist).rows.
                              super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3));
  piVar2 = (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar6 = dim + 1;
  uVar5 = 0;
  if ((char)bVar6 < '\x01') {
    bVar6 = 0;
  }
  fVar8 = -INFINITY;
  for (; uVar5 != bVar6; uVar5 = uVar5 + 1) {
    for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      iVar4 = piVar2[uVar5];
      iVar1 = piVar2[uVar7];
      fVar9 = 0.0;
      if (iVar4 != iVar1) {
        iVar3 = iVar1;
        if (iVar1 < iVar4) {
          iVar3 = iVar4;
        }
        if (iVar4 < iVar1) {
          iVar1 = iVar4;
        }
        fVar9 = (this->dist).rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                super__Vector_impl_data._M_start[iVar3][iVar1];
      }
      if (fVar9 <= fVar8) {
        fVar9 = fVar8;
      }
      fVar8 = fVar9;
    }
  }
  return fVar8;
}

Assistant:

value_t compute_diameter(const simplex_t index, const dimension_t dim) const {
    value_t diam = -std::numeric_limits<value_t>::infinity();

    vertices.resize(dim + 1);
    get_simplex_vertices(index, dim, dist.size(), vertices.rbegin());

    for (dimension_t i = 0; i <= dim; ++i)
      for (dimension_t j = 0; j < i; ++j) {
        diam = std::max(diam, dist(vertices[i], vertices[j]));
      }
    return diam;
  }